

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcPrsNode * __thiscall
CTcParser::parse_local_initializer(CTcParser *this,CTcSymLocal *lcl,int *err)

{
  CTcPrsNode *pCVar1;
  CTcPrsNode *pCVar2;
  _func_int **pp_Var3;
  CTcSymLocal *siz;
  
  siz = lcl;
  CTcTokenizer::next(G_tok);
  pCVar1 = parse_asi_expr(this);
  if (pCVar1 == (CTcPrsNode *)0x0) {
    pCVar1 = (CTcPrsNode *)0x0;
  }
  else if (lcl != (CTcSymLocal *)0x0) {
    pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)siz);
    pp_Var3 = (_func_int **)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,(size_t)siz);
    pp_Var3[1] = (_func_int *)lcl;
    *pp_Var3 = (_func_int *)&PTR_gen_code_0031fbe0;
    pCVar2[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var3;
    pCVar2[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar1;
    (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031eb90;
    pCVar1 = pCVar2;
  }
  return pCVar1;
}

Assistant:

CTcPrsNode *CTcParser::parse_local_initializer(CTcSymLocal *lcl, int *err)
{
    /* 
     *   skip the assignment operator and parse the expression (which
     *   cannot use the comma operator) 
     */
    G_tok->next();
    CTcPrsNode *expr = parse_asi_expr();

    /* if that failed, return failure */
    if (expr == 0)
        return 0;

    /* 
     *   if we have a valid local, return a new expression node for the
     *   assignment; otherwise just return the expression, since we have
     *   nothing to assign to 
     */
    return (lcl != 0 ? new CTPNAsi(new CTPNSymResolved(lcl), expr) : expr);
}